

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSqrt<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<double>_>_>_>_>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>
::val(FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSqrt<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<double>_>_>_>_>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>
      *this)

{
  double dVar1;
  double dVar2;
  int iVar3;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSqrt<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<double>_>_>_>_>_>_>,_Fad<double>_>_>
  *pFVar4;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSqrt<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<double>_>_>_>_>_>_>
  *pFVar5;
  FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *pFVar6
  ;
  FadExpr<FadFuncSqrt<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<double>_>_>_>_> *pFVar7;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar8;
  FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_> *pFVar9;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
  *pFVar10;
  double dVar11;
  
  pFVar4 = this->left_;
  pFVar5 = (pFVar4->fadexpr_).left_;
  pFVar6 = (pFVar5->fadexpr_).left_;
  pFVar7 = (pFVar5->fadexpr_).right_;
  iVar3 = (pFVar6->fadexpr_).left_.constant_;
  pFVar8 = (pFVar6->fadexpr_).right_;
  dVar1 = (pFVar8->fadexpr_).left_.constant_;
  dVar2 = ((pFVar8->fadexpr_).right_)->val_;
  dVar11 = ((pFVar7->fadexpr_).expr_.fadexpr_.left_)->val_ /
           (pFVar7->fadexpr_).expr_.fadexpr_.right_.constant_;
  if (dVar11 < 0.0) {
    dVar11 = sqrt(dVar11);
  }
  else {
    dVar11 = SQRT(dVar11);
  }
  pFVar9 = (this->right_->fadexpr_).left_;
  pFVar10 = (this->right_->fadexpr_).right_;
  pFVar8 = (pFVar10->fadexpr_).left_;
  return ((pFVar8->fadexpr_).left_.constant_ * ((pFVar8->fadexpr_).right_)->val_ *
          ((pFVar10->fadexpr_).right_)->val_ +
         (((pFVar9->fadexpr_).left_)->val_ - (pFVar9->fadexpr_).right_.constant_)) *
         ((double)iVar3 / (dVar1 * dVar2)) * dVar11 * ((pFVar4->fadexpr_).right_)->val_;
}

Assistant:

const value_type val() const {return left_.val() * right_.val() ;}